

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTree::removeItems(QGraphicsSceneBspTree *this,QSet<QGraphicsItem_*> *items)

{
  long lVar1;
  bool bVar2;
  QList<QList<QGraphicsItem_*>_> *this_00;
  qsizetype qVar3;
  reference this_01;
  long in_RDI;
  long in_FS_OFFSET;
  int j;
  QList<QGraphicsItem_*> *oldItemList;
  int i;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> newItemList;
  parameter_type in_stack_ffffffffffffff98;
  undefined4 local_4c;
  undefined4 local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  while( true ) {
    this_00 = (QList<QList<QGraphicsItem_*>_> *)(long)local_3c;
    qVar3 = QList<QList<QGraphicsItem_*>_>::size((QList<QList<QGraphicsItem_*>_> *)(in_RDI + 0x18));
    if (qVar3 <= (long)this_00) break;
    QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa18729);
    this_01 = QList<QList<QGraphicsItem_*>_>::operator[]
                        (this_00,(qsizetype)in_stack_ffffffffffffff98);
    local_4c = 0;
    while( true ) {
      in_stack_ffffffffffffff98 = (parameter_type)(long)local_4c;
      qVar3 = QList<QGraphicsItem_*>::size(this_01);
      if (qVar3 <= (long)in_stack_ffffffffffffff98) break;
      QList<QGraphicsItem_*>::at
                ((QList<QGraphicsItem_*> *)this_00,(qsizetype)in_stack_ffffffffffffff98);
      bVar2 = QSet<QGraphicsItem_*>::contains
                        ((QSet<QGraphicsItem_*> *)this_00,
                         (QGraphicsItem **)in_stack_ffffffffffffff98);
      if (!bVar2) {
        QList<QGraphicsItem_*>::operator<<
                  ((QList<QGraphicsItem_*> *)this_00,in_stack_ffffffffffffff98);
      }
      local_4c = local_4c + 1;
    }
    QList<QList<QGraphicsItem_*>_>::operator[](this_00,(qsizetype)in_stack_ffffffffffffff98);
    QList<QGraphicsItem_*>::operator=
              ((QList<QGraphicsItem_*> *)this_00,(QList<QGraphicsItem_*> *)in_stack_ffffffffffffff98
              );
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa187e9);
    local_3c = local_3c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::removeItems(const QSet<QGraphicsItem *> &items)
{
    for (int i = 0; i < leaves.size(); ++i) {
        QList<QGraphicsItem *> newItemList;
        const QList<QGraphicsItem *> &oldItemList = leaves[i];
        for (int j = 0; j < oldItemList.size(); ++j) {
            QGraphicsItem *item = oldItemList.at(j);
            if (!items.contains(item))
                newItemList << item;
        }
        leaves[i] = newItemList;
    }
}